

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_profile.c
# Opt level: O2

void luaJIT_profile_stop(lua_State *L)

{
  size_t *psVar1;
  global_State *g;
  undefined8 uVar2;
  uint uVar3;
  
  g = profile_state.g;
  if (profile_state.g == (global_State *)(ulong)(L->glref).ptr32) {
    lj_profile_timer_stop(&profile_state.timer);
    g->hookmask = g->hookmask & 0x7f;
    lj_dispatch_update(g);
    g[5].strempty.marked = '\0';
    g[5].strempty.gct = '\0';
    g[5].strempty.reserved = '\0';
    g[5].strempty.strflags = '\0';
    lj_trace_flushall(L);
    uVar2 = profile_state.sb._4_8_;
    uVar3 = profile_state.sb.e.ptr32 - profile_state.sb.b.ptr32;
    (g->gc).total = (g->gc).total - uVar3;
    psVar1 = &(g->gc).freed;
    *psVar1 = *psVar1 + (ulong)uVar3;
    (*g->allocf)(g->allocd,SUB88(uVar2,4),(ulong)uVar3,0);
    profile_state.sb.e.ptr32 = 0;
    profile_state.sb.b.ptr32 = 0;
    profile_state.g = (global_State *)0x0;
  }
  return;
}

Assistant:

LUA_API void luaJIT_profile_stop(lua_State *L)
{
  ProfileState *ps = &profile_state;
  global_State *g = ps->g;
  if (G(L) == g) {  /* Only stop profiler if started by this VM. */
    lj_profile_timer_stop(&ps->timer);
    g->hookmask &= ~HOOK_PROFILE;
    lj_dispatch_update(g);
#if LJ_HASJIT
    G2J(g)->prof_mode = 0;
    lj_trace_flushall(L);
#endif
    lj_buf_free(g, &ps->sb);
    setmref(ps->sb.b, NULL);
    setmref(ps->sb.e, NULL);
    ps->g = NULL;
  }
}